

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3TruncateNode(char *aNode,int nNode,Blob *pNew,char *zTerm,int nTerm,sqlite3_int64 *piBlock)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  NodeReader reader;
  Blob prev;
  int local_a4;
  ulong *local_a0;
  int local_94;
  char *local_90;
  char *local_88;
  NodeReader local_80;
  Blob local_48;
  
  local_48.a = (char *)0x0;
  local_48.n = 0;
  local_48.nAlloc = 0;
  local_a4 = 0;
  cVar1 = *aNode;
  local_a0 = (ulong *)piBlock;
  local_94 = nTerm;
  blobGrowBuffer(pNew,nNode,&local_a4);
  iVar5 = local_94;
  if (local_a4 == 0) {
    pNew->n = 0;
    local_88 = zTerm;
    iVar6 = nodeReaderInit(&local_80,aNode,nNode);
    local_90 = aNode;
    if ((iVar6 == 0) && (local_80.aNode != (char *)0x0)) {
      do {
        if (pNew->n == 0) {
          iVar9 = local_80.term.n - iVar5;
          iVar6 = local_80.term.n;
          if (iVar5 <= local_80.term.n) {
            iVar6 = iVar5;
          }
          iVar6 = memcmp(local_80.term.a,local_88,(long)iVar6);
          if (iVar6 != 0) {
            iVar9 = iVar6;
          }
          if ((iVar9 != 0 || cVar1 == '\0') && -1 < iVar9) {
            *pNew->a = *local_90;
            if (local_80.iChild == 0) {
              lVar8 = 1;
            }
            else {
              pcVar2 = pNew->a;
              lVar8 = 1;
              uVar10 = local_80.iChild;
              do {
                lVar7 = lVar8;
                bVar4 = (byte)uVar10;
                pcVar2[lVar7] = bVar4 | 0x80;
                lVar8 = lVar7 + 1;
                bVar3 = 0x7f < uVar10;
                uVar10 = uVar10 >> 7;
              } while (bVar3);
              pcVar2[lVar7] = bVar4;
            }
            pNew->n = (int)lVar8;
            *local_a0 = local_80.iChild;
            if ((iVar9 != 0 || cVar1 == '\0') && -1 < iVar9) goto LAB_001c4d8c;
          }
        }
        else {
LAB_001c4d8c:
          iVar6 = fts3AppendToNode(pNew,&local_48,local_80.term.a,local_80.term.n,local_80.aDoclist,
                                   local_80.nDoclist);
          if (iVar6 != 0) break;
        }
        iVar6 = nodeReaderNext(&local_80);
        if ((iVar6 != 0) || (local_80.aNode == (char *)0x0)) break;
      } while( true );
    }
    if (pNew->n == 0) {
      *pNew->a = *local_90;
      if (local_80.iChild == 0) {
        lVar8 = 1;
      }
      else {
        pcVar2 = pNew->a;
        lVar8 = 1;
        uVar10 = local_80.iChild;
        do {
          lVar7 = lVar8;
          bVar4 = (byte)uVar10;
          pcVar2[lVar7] = bVar4 | 0x80;
          lVar8 = lVar7 + 1;
          bVar3 = 0x7f < uVar10;
          uVar10 = uVar10 >> 7;
        } while (bVar3);
        pcVar2[lVar7] = bVar4;
      }
      pNew->n = (int)lVar8;
      *local_a0 = local_80.iChild;
    }
    local_a4 = iVar6;
    sqlite3_free(local_80.term.a);
    sqlite3_free(local_48.a);
  }
  return local_a4;
}

Assistant:

static int fts3TruncateNode(
  const char *aNode,              /* Current node image */
  int nNode,                      /* Size of aNode in bytes */
  Blob *pNew,                     /* OUT: Write new node image here */
  const char *zTerm,              /* Omit all terms smaller than this */
  int nTerm,                      /* Size of zTerm in bytes */
  sqlite3_int64 *piBlock          /* OUT: Block number in next layer down */
){
  NodeReader reader;              /* Reader object */
  Blob prev = {0, 0, 0};          /* Previous term written to new node */
  int rc = SQLITE_OK;             /* Return code */
  int bLeaf = aNode[0]=='\0';     /* True for a leaf node */

  /* Allocate required output space */
  blobGrowBuffer(pNew, nNode, &rc);
  if( rc!=SQLITE_OK ) return rc;
  pNew->n = 0;

  /* Populate new node buffer */
  for(rc = nodeReaderInit(&reader, aNode, nNode); 
      rc==SQLITE_OK && reader.aNode; 
      rc = nodeReaderNext(&reader)
  ){
    if( pNew->n==0 ){
      int res = fts3TermCmp(reader.term.a, reader.term.n, zTerm, nTerm);
      if( res<0 || (bLeaf==0 && res==0) ) continue;
      fts3StartNode(pNew, (int)aNode[0], reader.iChild);
      *piBlock = reader.iChild;
    }
    rc = fts3AppendToNode(
        pNew, &prev, reader.term.a, reader.term.n,
        reader.aDoclist, reader.nDoclist
    );
    if( rc!=SQLITE_OK ) break;
  }
  if( pNew->n==0 ){
    fts3StartNode(pNew, (int)aNode[0], reader.iChild);
    *piBlock = reader.iChild;
  }
  assert( pNew->n<=pNew->nAlloc );

  nodeReaderRelease(&reader);
  sqlite3_free(prev.a);
  return rc;
}